

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  ExprList *pEVar1;
  SrcList *pExpr_00;
  bool bVar2;
  KeyInfo *pKVar3;
  u8 uVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Vdbe *p;
  Expr *pEVar10;
  Select *pSVar11;
  CollSeq *pCVar12;
  Expr *pEVar13;
  uint p2;
  char *pcVar14;
  Op *pOVar15;
  int iVar16;
  ExprList_item *pEVar17;
  SrcList **ppSVar18;
  ulong uVar19;
  uint N;
  int iValToIns;
  uint local_94;
  char local_8d;
  int local_8c;
  ulong local_88;
  KeyInfo *local_80;
  Expr *local_78;
  Expr *local_70;
  int local_68;
  int local_64;
  Walker local_60;
  
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    return 0;
  }
  local_94 = 0xffffffff;
  if ((pExpr->flags & 0x20) == 0) {
    local_94 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  }
  local_78 = pExpr;
  if (pExpr->op != '1') {
    pSVar11 = (pExpr->x).pSelect;
    pcVar14 = "CORRELATED ";
    if (-1 < (int)local_94) {
      pcVar14 = "";
    }
    iVar7 = 1;
    sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY",pcVar14);
    uVar4 = pExpr->op;
    if (uVar4 == '\x7f') {
      iVar7 = pSVar11->pEList->nExpr;
    }
    local_60.pParse._4_4_ = pParse->nMem + 1;
    iVar8 = pParse->nMem + iVar7;
    local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
    local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    pParse->nMem = iVar8;
    if (uVar4 == '\x7f') {
      local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,10);
      local_60.xExprCallback =
           (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iVar7,local_60.pParse._4_4_);
      iVar7 = 0x49;
    }
    else {
      local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,3);
      iVar7 = 0x46;
      iVar8 = 0;
    }
    sqlite3VdbeAddOp3(p,iVar7,0,local_60.pParse._4_4_,iVar8);
    pEVar10 = sqlite3ExprAlloc(pParse->db,0x8f,sqlite3IntTokens + 1,0);
    if (pSVar11->pLimit == (Expr *)0x0) {
      pEVar10 = sqlite3PExpr(pParse,0x89,pEVar10,(Expr *)0x0);
      pSVar11->pLimit = pEVar10;
    }
    else {
      pEVar13 = pSVar11->pLimit->pLeft;
      if (pEVar13 != (Expr *)0x0) {
        sqlite3ExprDeleteNN(pParse->db,pEVar13);
      }
      pSVar11->pLimit->pLeft = pEVar10;
    }
    pSVar11->iLimit = 0;
    iVar8 = sqlite3Select(pParse,pSVar11,(SelectDest *)&local_60);
    iVar7 = local_60.pParse._4_4_;
    if (iVar8 != 0) {
      return 0;
    }
    goto LAB_001693c5;
  }
  local_70 = pExpr->pLeft;
  uVar4 = local_70->op;
  if (uVar4 == 0xa4) {
    uVar4 = local_70->op2;
  }
  if (uVar4 == '\x7f') {
    pSVar11 = (local_70->x).pSelect;
LAB_00168f29:
    N = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pList->nExpr;
  }
  else {
    N = 1;
    if (uVar4 == 0xa5) {
      pSVar11 = (Select *)&local_70->x;
      goto LAB_00168f29;
    }
  }
  iVar7 = pParse->nTab;
  pParse->nTab = iVar7 + 1;
  pExpr->iTable = iVar7;
  p2 = 0;
  if (isRowid == 0) {
    p2 = N;
  }
  local_64 = sqlite3VdbeAddOp3(p,0x71,iVar7,p2,0);
  local_8c = rHasNullFlag;
  if (isRowid == 0) {
    local_80 = sqlite3KeyInfoAlloc(pParse->db,N,1);
  }
  else {
    local_80 = (KeyInfo *)0x0;
  }
  pSVar11 = (Select *)(local_78->x).pList;
  if ((local_78->flags & 0x800) == 0) {
    if (pSVar11 != (Select *)0x0) {
      cVar5 = sqlite3ExprAffinity(local_70);
      pKVar3 = local_80;
      local_8d = 'A';
      if (cVar5 != '\0') {
        local_8d = cVar5;
      }
      if (local_80 != (KeyInfo *)0x0) {
        pCVar12 = sqlite3ExprCollSeq(pParse,local_78->pLeft);
        pKVar3->aColl[0] = pCVar12;
      }
      if (pParse->nTempReg == '\0') {
        iVar7 = pParse->nMem + 1;
        pParse->nMem = iVar7;
      }
      else {
        bVar6 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar6;
        iVar7 = pParse->aTempReg[bVar6];
      }
      local_70 = (Expr *)CONCAT44(local_70._4_4_,iVar7);
      if (pParse->nTempReg == '\0') {
        iVar7 = pParse->nMem + 1;
        pParse->nMem = iVar7;
      }
      else {
        bVar6 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar6;
        iVar7 = pParse->aTempReg[bVar6];
      }
      local_88 = CONCAT44(local_88._4_4_,iVar7);
      if (isRowid != 0) {
        iVar7 = sqlite3VdbeAddOp3(p,0x4b,0,iVar7,0);
        sqlite3VdbeChangeP4(p,iVar7,"",-1);
      }
      if (0 < *(int *)&pSVar11->pEList) {
        ppSVar18 = (SrcList **)&pSVar11->op;
        iVar7 = *(int *)&pSVar11->pEList + 1;
        local_68 = isRowid;
        do {
          pExpr_00 = *ppSVar18;
          if (-1 < (int)local_94) {
            local_60.eCode = '\x01';
            local_60.xExprCallback = exprNodeIsConstant;
            local_60.xSelectCallback = sqlite3SelectWalkFail;
            local_60.u.n = 0;
            if (pExpr_00 != (SrcList *)0x0) {
              walkExpr(&local_60,(Expr *)pExpr_00);
            }
            if (local_60.eCode == '\0') {
              sqlite3VdbeChangeToNoop(p,local_94);
              local_94 = 0xffffffff;
            }
          }
          if ((isRowid == 0) ||
             (iVar8 = sqlite3ExprIsInteger((Expr *)pExpr_00,(int *)&local_60), iVar8 == 0)) {
            iVar8 = sqlite3ExprCodeTarget(pParse,(Expr *)pExpr_00,(int)local_70);
            if (isRowid != 0) {
              sqlite3VdbeAddOp3(p,0xf,iVar8,p->nOp + 2,0);
              iVar16 = local_78->iTable;
              iVar9 = 0x7a;
              goto LAB_00169234;
            }
            iVar16 = (int)local_88;
            iVar9 = sqlite3VdbeAddOp3(p,0x66,iVar8,1,(int)local_88);
            sqlite3VdbeChangeP4(p,iVar9,&local_8d,1);
            isRowid = local_68;
            iVar8 = sqlite3VdbeAddOp3(p,0x85,local_78->iTable,iVar16,iVar8);
            if (p->db->mallocFailed == '\0') {
              pOVar15 = p->aOp;
              pOVar15[iVar8].p4type = -3;
              pOVar15[iVar8].p4.i = 1;
            }
          }
          else {
            iVar16 = local_78->iTable;
            iVar9 = 0x7b;
            iVar8 = (int)local_60.pParse;
LAB_00169234:
            sqlite3VdbeAddOp3(p,iVar9,iVar16,(int)local_88,iVar8);
          }
          ppSVar18 = ppSVar18 + 4;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      if ((int)local_70 != 0) {
        bVar6 = pParse->nTempReg;
        if ((ulong)bVar6 < 8) {
          pParse->nTempReg = bVar6 + 1;
          pParse->aTempReg[bVar6] = (int)local_70;
        }
      }
      if ((int)local_88 != 0) {
        bVar6 = pParse->nTempReg;
        if ((ulong)bVar6 < 8) {
          pParse->nTempReg = bVar6 + 1;
          pParse->aTempReg[bVar6] = (int)local_88;
        }
      }
    }
LAB_0016939f:
    rHasNullFlag = local_8c;
    bVar2 = true;
    if (local_80 != (KeyInfo *)0x0) {
      sqlite3VdbeChangeP4(p,local_64,(char *)local_80,-9);
    }
  }
  else {
    pEVar1 = pSVar11->pEList;
    pcVar14 = "CORRELATED ";
    if (-1 < (int)local_94) {
      pcVar14 = "";
    }
    sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY",pcVar14);
    if (pEVar1->nExpr != N) goto LAB_0016939f;
    local_60.pParse._4_4_ = local_78->iTable;
    local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,0xb);
    local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
    local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_78);
    pSVar11->iLimit = 0;
    local_68 = sqlite3Select(pParse,pSVar11,(SelectDest *)&local_60);
    pKVar3 = local_80;
    if (local_68 == 0) {
      if (local_60.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
        sqlite3DbFreeNN(pParse->db,local_60.xSelectCallback);
      }
      pEVar10 = local_70;
      pKVar3 = local_80;
      if (0 < (int)N) {
        pEVar17 = pEVar1->a;
        uVar19 = 0;
        local_88 = (ulong)N;
        do {
          pEVar13 = sqlite3VectorFieldSubexpr(pEVar10,(int)uVar19);
          pCVar12 = sqlite3BinaryCompareCollSeq(pParse,pEVar13,pEVar17->pExpr);
          pKVar3->aColl[uVar19] = pCVar12;
          uVar19 = uVar19 + 1;
          pEVar17 = pEVar17 + 1;
        } while (local_88 != uVar19);
      }
    }
    else {
      if (local_60.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
        sqlite3DbFreeNN(pParse->db,local_60.xSelectCallback);
      }
      if ((pKVar3 != (KeyInfo *)0x0) && (pKVar3->nRef = pKVar3->nRef - 1, pKVar3->nRef == 0)) {
        sqlite3DbFreeNN(pKVar3->db,pKVar3);
      }
    }
    if (local_68 == 0) goto LAB_0016939f;
    bVar2 = false;
    rHasNullFlag = local_8c;
  }
  iVar7 = 0;
  if (!bVar2) {
    return 0;
  }
LAB_001693c5:
  if (rHasNullFlag != 0) {
    sqlite3SetHasNullFlag(p,local_78->iTable,rHasNullFlag);
  }
  if (-1 < (int)local_94) {
    if (p->db->mallocFailed == '\0') {
      pOVar15 = p->aOp + local_94;
    }
    else {
      pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar15->p2 = p->nOp;
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "
        ));
        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;
        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp4(v, OP_Blob, 0, r2, 0, "", P4_STATIC);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */
      Expr *pLimit;                         /* New limit expression */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "));
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
      if( pSel->pLimit ){
        sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
        pSel->pLimit->pLeft = pLimit;
      }else{
        pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
      }
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }

  return rReg;
}